

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O1

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> * __thiscall
pstack::Procman::CoreProcess::addressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,CoreProcess *this)

{
  size_type *psVar1;
  size_t *psVar2;
  long lVar3;
  mapped_type *this_00;
  long *plVar4;
  _Base_ptr p_Var5;
  long lVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  iterator pos;
  undefined1 local_190 [8];
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  entries;
  iterator __begin2;
  _Rb_tree<pstack::Procman::AddressRange::VmFlag,_pstack::Procman::AddressRange::VmFlag,_std::_Identity<pstack::Procman::AddressRange::VmFlag>,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
  local_e0;
  CoreProcess *local_b0;
  undefined1 local_a8 [8];
  set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
  flags;
  undefined1 local_70 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
  entry;
  vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *rv;
  
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&entries;
  entries._M_t._M_impl._0_4_ = 0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_b0 = this;
  entry.second.fileOff = (Off)__return_storage_ptr__;
  FileEntries::FileEntries
            ((FileEntries *)local_a8,
             (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  pos.idx = 0;
  pos.arrayp = (ReaderArray<pstack::Procman::FileEntry,_42UL> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FileEntries::iterator::iterator
            ((iterator *)&entries._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (FileEntries *)local_a8,pos);
  if (__begin2.entriesIterator.arrayp !=
      *(ReaderArray<pstack::Procman::FileEntry,_42UL> **)(__begin2.cur.second.fileOff + 0x20)) {
    psVar1 = &entry.first._M_string_length;
    psVar2 = &entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      FileEntries::iterator::fetch((iterator *)psVar2);
      local_70 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,__begin2.nameoff,
                 __begin2.cur.first._M_dataplus._M_p + __begin2.nameoff);
      entry.second.end = __begin2.cur.second.end;
      entry.first.field_2._8_8_ = __begin2.cur.first.field_2._8_8_;
      entry.second.start = __begin2.cur.second.start;
      this_00 = std::
                map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                              *)local_190,
                             (key_type_conflict *)(entry.first.field_2._M_local_buf + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&this_00->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      (this_00->second).fileOff = entry.second.end;
      (this_00->second).start = entry.first.field_2._8_8_;
      (this_00->second).end = entry.second.start;
      if (local_70 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_70,
                        CONCAT71(entry.first._M_string_length._1_7_,
                                 (undefined1)entry.first._M_string_length) + 1);
      }
      FileEntries::iterator::fetch((iterator *)psVar2);
      __begin2.entriesIterator.arrayp =
           (ReaderArray<pstack::Procman::FileEntry,_42UL> *)
           ((long)&(__begin2.entriesIterator.arrayp)->reader + 1);
      __begin2._8_8_ = __begin2.cur.first._M_dataplus._M_p + __begin2._8_8_ + 1;
      __begin2.entries = (FileEntries *)((ulong)__begin2.entries & 0xffffffffffffff00);
    } while (__begin2.entriesIterator.arrayp !=
             *(ReaderArray<pstack::Procman::FileEntry,_42UL> **)(__begin2.cur.second.fileOff + 0x20)
            );
  }
  if ((size_type *)__begin2.nameoff != &__begin2.cur.first._M_string_length) {
    operator_delete((void *)__begin2.nameoff,__begin2.cur.first._M_string_length + 1);
  }
  if (flags._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  if (flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left != (_Base_ptr)0x0) {
    operator_delete(flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0x418);
  }
  flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  if (flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  *(undefined8 *)entry.second.fileOff = 0;
  *(undefined8 *)(entry.second.fileOff + 8) = 0;
  *(undefined8 *)(entry.second.fileOff + 0x10) = 0;
  plVar4 = (long *)pstack::Elf::Object::getSegments
                             ((uint)(local_b0->coreImage).
                                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
  lVar7 = *plVar4;
  lVar3 = plVar4[1];
  if (lVar7 != lVar3) {
    psVar2 = &entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      p_Var8 = (_Rb_tree_node_base *)&entries;
      if (entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        p_Var5 = (_Base_ptr)entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        do {
          bVar9 = *(_Base_ptr *)(p_Var5 + 1) <= *(_Base_ptr *)(lVar7 + 0x10);
          if (!bVar9) {
            p_Var8 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[bVar9];
        } while (p_Var5 != (_Base_ptr)0x0);
      }
      local_70 = (undefined1  [8])&entry.first._M_string_length;
      entry.first._M_dataplus._M_p = (pointer)0x0;
      entry.first._M_string_length._0_1_ = 0;
      if (p_Var8 != entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        lVar6 = std::_Rb_tree_decrement(p_Var8);
        if ((*(ulong *)(lVar7 + 0x10) <= *(ulong *)(lVar6 + 0x20)) &&
           (*(ulong *)(lVar6 + 0x50) <= *(ulong *)(lVar7 + 0x10) + *(long *)(lVar7 + 0x28))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar6 + 0x28));
        }
      }
      flags._M_t._M_impl._0_4_ = 0;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flags;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((*(byte *)(lVar7 + 4) & 2) != 0) {
        entries._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT44(entries._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,1);
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                  ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                    *)local_a8,(Permission *)psVar2);
      }
      if ((*(byte *)(lVar7 + 4) & 4) != 0) {
        entries._M_t._M_impl.super__Rb_tree_header._M_node_count =
             entries._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff00000000;
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                  ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                    *)local_a8,(Permission *)psVar2);
      }
      if ((*(byte *)(lVar7 + 4) & 1) != 0) {
        entries._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT44(entries._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,2);
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                  ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                    *)local_a8,(Permission *)psVar2);
      }
      entries._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(lVar7 + 0x10);
      __begin2.entries =
           (FileEntries *)
           (*(long *)(lVar7 + 0x28) + entries._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __begin2._8_8_ =
           entries._M_t._M_impl.super__Rb_tree_header._M_node_count + *(long *)(lVar7 + 0x20);
      __begin2.nameoff = 0;
      __begin2.cur.first._M_dataplus._M_p = (pointer)0x0;
      __begin2.cur.first._M_string_length = 0;
      __begin2.cur.first.field_2._M_allocated_capacity = (size_type)&__begin2.cur.second;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__begin2.cur.first.field_2,local_70,
                 entry.first._M_dataplus._M_p + (long)local_70);
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)&__begin2.cur.second.fileOff,
                 (_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)local_a8);
      local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0._M_impl._0_8_ = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e0._M_impl.super__Rb_tree_header._M_header;
      local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
      emplace_back<pstack::Procman::AddressRange>
                ((vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
                  *)entry.second.fileOff,(AddressRange *)psVar2);
      std::
      _Rb_tree<pstack::Procman::AddressRange::VmFlag,_pstack::Procman::AddressRange::VmFlag,_std::_Identity<pstack::Procman::AddressRange::VmFlag>,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
      ::~_Rb_tree(&local_e0);
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::~_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                   *)&__begin2.cur.second.fileOff);
      if ((FileEntry *)__begin2.cur.first.field_2._M_allocated_capacity != &__begin2.cur.second) {
        operator_delete((void *)__begin2.cur.first.field_2._M_allocated_capacity,
                        __begin2.cur.second.start + 1);
      }
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::~_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                   *)local_a8);
      if (local_70 != (undefined1  [8])&entry.first._M_string_length) {
        operator_delete((void *)local_70,
                        CONCAT71(entry.first._M_string_length._1_7_,
                                 (undefined1)entry.first._M_string_length) + 1);
      }
      lVar7 = lVar7 + 0x38;
    } while (lVar7 != lVar3);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
               *)local_190);
  return (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *)
         entry.second.fileOff;
}

Assistant:

std::vector<AddressRange>
CoreProcess::addressSpace() const {
    // First, go through the NT_FILE note if we have one - that gives us filenames
    std::map<Elf::Off, std::pair<std::string, FileEntry>> entries;
    for (auto entry : FileEntries(*coreImage))
        entries[entry.second.start] = entry;

    // Now go through the PT_LOAD segments in the core to generate the result.
    std::vector<AddressRange> rv;
    for (const auto &hdr : coreImage->getSegments(PT_LOAD)) {
        auto ub = entries.upper_bound(hdr.p_vaddr);
        std::string name;
        if (ub != entries.begin()) {
            --ub;
            if (ub->first >= hdr.p_vaddr && ub->second.second.end <= hdr.p_vaddr + hdr.p_memsz)
                name = ub->second.first;
        }
        std::set<AddressRange::Permission> flags;
        if ((hdr.p_flags & PF_W) != 0)
           flags.insert(AddressRange::Permission::write);
        if ((hdr.p_flags & PF_R) != 0)
           flags.insert(AddressRange::Permission::read);
        if ((hdr.p_flags & PF_X) != 0)
           flags.insert(AddressRange::Permission::exec);
        rv.push_back( { hdr.p_vaddr, hdr.p_vaddr + hdr.p_memsz,
                hdr.p_vaddr + hdr.p_filesz, 0, {0, 0, 0, name}, flags, {}});
    }
    return rv;
}